

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O0

void __thiscall Liby::UdpSocket::handleConnectEvent(UdpSocket *this,Endpoint *ep)

{
  bool bVar1;
  element_type *__args;
  pair<Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_> local_58;
  Endpoint local_40;
  undefined1 local_38 [8];
  shared_ptr<Liby::UdpConnection> uconn;
  _Self local_20;
  iterator it;
  Endpoint *ep_local;
  UdpSocket *this_local;
  
  it._M_node = (_Base_ptr)ep;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>,_std::less<Liby::Endpoint>,_std::allocator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>_>
       ::find(&this->conns_,ep);
  uconn.super___shared_ptr<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       map<Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>,_std::less<Liby::Endpoint>,_std::allocator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>_>
       ::end(&this->conns_);
  bVar1 = std::operator!=(&local_20,
                          (_Self *)&uconn.
                                    super___shared_ptr<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
  if (!bVar1) {
    local_40 = (Endpoint)this;
    std::make_shared<Liby::UdpConnection,Liby::UdpSocket*,Liby::Endpoint_const&>
              ((UdpSocket **)local_38,&local_40);
    std::make_pair<Liby::Endpoint_const&,std::shared_ptr<Liby::UdpConnection>&>
              (&local_58,(Endpoint *)it._M_node,(shared_ptr<Liby::UdpConnection> *)local_38);
    std::
    map<Liby::Endpoint,std::shared_ptr<Liby::UdpConnection>,std::less<Liby::Endpoint>,std::allocator<std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>>>
    ::insert<std::pair<Liby::Endpoint,std::shared_ptr<Liby::UdpConnection>>>
              ((map<Liby::Endpoint,std::shared_ptr<Liby::UdpConnection>,std::less<Liby::Endpoint>,std::allocator<std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>>>
                *)&this->conns_,&local_58);
    std::pair<Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>::~pair(&local_58);
    bVar1 = std::function::operator_cast_to_bool((function *)&this->connectorCallback_);
    if (bVar1) {
      __args = std::
               __shared_ptr_access<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_38);
      std::function<void_(Liby::UdpConnection_&)>::operator()(&this->connectorCallback_,__args);
    }
    std::shared_ptr<Liby::UdpConnection>::~shared_ptr((shared_ptr<Liby::UdpConnection> *)local_38);
  }
  return;
}

Assistant:

void UdpSocket::handleConnectEvent(const Endpoint &ep) {
    auto it = conns_.find(ep);
    if (it != conns_.end())
        return;

    auto uconn = std::make_shared<UdpConnection>(this, ep);
    conns_.insert(std::make_pair(ep, uconn));
    if (connectorCallback_) {
        connectorCallback_(*uconn);
    }
}